

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentDiscreteObservations.cpp
# Opt level: O2

void __thiscall
MADPComponentDiscreteObservations::MADPComponentDiscreteObservations
          (MADPComponentDiscreteObservations *this)

{
  this->_vptr_MADPComponentDiscreteObservations =
       (_func_int **)&PTR__MADPComponentDiscreteObservations_00610d10;
  this->_m_initialized = false;
  this->_m_cachedAllJointObservations = false;
  this->_m_observationStepSize = (size_t *)0x0;
  (this->_m_jointObservationVec).
  super__Vector_base<JointObservationDiscrete_*,_std::allocator<JointObservationDiscrete_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_jointObservationVec).
  super__Vector_base<JointObservationDiscrete_*,_std::allocator<JointObservationDiscrete_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_m_jointObservationVec).
  super__Vector_base<JointObservationDiscrete_*,_std::allocator<JointObservationDiscrete_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->_m_jointObservationIndices =
       (map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>_>
        *)0x0;
  (this->_m_nrObservations).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_nrObservations).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_m_nrObservations).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_m_jointObservationVec).
  super__Vector_base<JointObservationDiscrete_*,_std::allocator<JointObservationDiscrete_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->_m_jointObservationIndices =
       (map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>_>
        *)0x0;
  (this->_m_nrObservations).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_nrObservations).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_m_nrObservations).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_m_observationVecs).
  super__Vector_base<std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>,_std::allocator<std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_observationVecs).
  super__Vector_base<std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>,_std::allocator<std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_m_observationVecs).
  super__Vector_base<std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>,_std::allocator<std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->_m_jointIndicesValid = true;
  this->_m_nrJointObservations = 0;
  return;
}

Assistant:

MADPComponentDiscreteObservations::MADPComponentDiscreteObservations()
{
    _m_initialized = false;
    _m_observationStepSize = 0;
    _m_cachedAllJointObservations=false;
    _m_jointObservationIndices=0;
    _m_jointIndicesValid=true;
    _m_nrJointObservations=0;
}